

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall pbrt::ParameterDictionary::ReportUnused(ParameterDictionary *this)

{
  ParsedParameter **ppPVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar2;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  size_t sVar4;
  ParsedParameter *this_00;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar8;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar9;
  long lVar10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar11;
  InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  seen;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_160;
  undefined1 local_150 [272];
  size_t local_40;
  ulong uStack_38;
  
  local_150._0_8_ = pstd::pmr::new_delete_resource();
  local_150._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        *)0x0;
  local_40 = 0;
  uStack_38 = 0;
  paVar3 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar4 = (this->params).nStored;
  paVar9 = &(this->params).field_2;
  if (paVar3 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar9 = paVar3;
  }
  if (sVar4 == 0) {
    lVar10 = 0;
  }
  else {
    ppPVar1 = paVar9->fixed + sVar4;
    do {
      uVar6 = uStack_38;
      this_00 = paVar9->fixed[0];
      if (this_00->mayBeUnused == false) {
        ppVar8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)local_150._8_8_;
        if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)local_150._8_8_ ==
            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)0x0) {
          ppVar8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)(local_150 + 0x10);
        }
        uVar7 = uStack_38 * 0x10;
        ppVar2 = ppVar8 + uStack_38;
        if (0 < (long)uStack_38 >> 2) {
          lVar10 = ((long)uStack_38 >> 2) + 1;
          ppVar11 = ppVar8 + 2;
          do {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                        *)ppVar11[-2].first);
            if (bVar5) {
              ppVar11 = ppVar11 + -2;
              goto LAB_003fa748;
            }
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                        *)ppVar11[-1].first);
            if (bVar5) {
              ppVar11 = ppVar11 + -1;
              goto LAB_003fa748;
            }
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                        *)ppVar11->first);
            if (bVar5) goto LAB_003fa748;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                        *)ppVar11[1].first);
            if (bVar5) {
              ppVar11 = ppVar11 + 1;
              goto LAB_003fa748;
            }
            lVar10 = lVar10 + -1;
            ppVar11 = ppVar11 + 4;
          } while (1 < lVar10);
          uVar6 = (ulong)((uint)uVar6 & 3);
          ppVar8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)((long)&ppVar8->first + (uVar7 & 0xffffffffffffffc0));
        }
        if (uVar6 == 1) {
LAB_003fa78e:
          bVar5 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>
                  ::operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                        *)ppVar8->first);
          ppVar11 = ppVar8;
          if (!bVar5) {
            ppVar11 = ppVar2;
          }
        }
        else if (uVar6 == 2) {
LAB_003fa714:
          bVar5 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>
                  ::operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                        *)ppVar8->first);
          ppVar11 = ppVar8;
          if (!bVar5) {
            ppVar8 = ppVar8 + 1;
            goto LAB_003fa78e;
          }
        }
        else {
          ppVar11 = ppVar2;
          if ((uVar6 == 3) &&
             (bVar5 = __gnu_cxx::__ops::
                      _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                                ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                                 this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                          *)ppVar8->first), ppVar11 = ppVar8, !bVar5)) {
            ppVar8 = ppVar8 + 1;
            goto LAB_003fa714;
          }
        }
LAB_003fa748:
        if (this_00->lookedUp == true) {
          if (ppVar11 == ppVar2) {
            local_160.second = &this_00->name;
            local_160.first = &this_00->type;
            InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::push_back((InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                         *)local_150,&local_160);
          }
        }
        else if (ppVar11 == ppVar2) {
          ErrorExit<std::__cxx11::string_const&>
                    (&this_00->loc,"\"%s\": unused parameter.",&this_00->name);
        }
      }
      paVar9 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)((long)paVar9 + 8);
    } while (paVar9 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                        *)ppPVar1);
    lVar10 = local_40 << 4;
  }
  uStack_38 = 0;
  (*(*(_func_int ***)local_150._0_8_)[3])(local_150._0_8_,local_150._8_8_,lVar10,8);
  return;
}

Assistant:

void ParameterDictionary::ReportUnused() const {
    // type / name
    InlinedVector<std::pair<const std::string *, const std::string *>, 16> seen;

    for (const ParsedParameter *p : params) {
        if (p->mayBeUnused)
            continue;

        bool haveSeen =
            std::find_if(seen.begin(), seen.end(),
                         [&p](std::pair<const std::string *, const std::string *> p2) {
                             return *p2.first == p->type && *p2.second == p->name;
                         }) != seen.end();
        if (p->lookedUp) {
            // A parameter may be used when creating an initial Material, say,
            // but then an override from a Shape may shadow it such that its
            // name is already in the seen array.
            if (!haveSeen)
                seen.push_back(std::make_pair(&p->type, &p->name));
        } else if (haveSeen) {
            // It's shadowed by another parameter; that's fine.
        } else
            ErrorExit(&p->loc, "\"%s\": unused parameter.", p->name);
    }
}